

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_infer_nedge_nface(REF_GRID ref_grid)

{
  REF_GEOM pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_INT min_id;
  REF_INT max_id;
  int local_30;
  REF_INT local_2c;
  
  pRVar1 = ref_grid->geom;
  uVar3 = ref_cell_id_range(ref_grid->cell[3],ref_grid->mpi,&local_30,&local_2c);
  iVar2 = local_30;
  if (uVar3 == 0) {
    if ((long)local_30 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x9a2,
             "ref_geom_infer_nedge_nface","first face id not 1",1,(long)local_30);
      uVar3 = 1;
    }
    uVar4 = uVar3;
    if (iVar2 == 1) {
      pRVar1->nface = local_2c;
      uVar4 = ref_cell_id_range(ref_grid->cell[0],ref_grid->mpi,&local_30,&local_2c);
      if (uVar4 == 0) {
        uVar4 = uVar3;
        if ((long)local_30 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x9a7,"ref_geom_infer_nedge_nface","first edge id not 1",1,(long)local_30);
          uVar4 = 1;
        }
        if (local_30 == 1) {
          pRVar1->nedge = local_2c;
          uVar4 = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x9a6,"ref_geom_infer_nedge_nface",(ulong)uVar4,"edge range");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x9a1,
           "ref_geom_infer_nedge_nface",(ulong)uVar3,"face range");
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_infer_nedge_nface(REF_GRID ref_grid) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT min_id, max_id;
  RSS(ref_cell_id_range(ref_grid_tri(ref_grid), ref_grid_mpi(ref_grid), &min_id,
                        &max_id),
      "face range");
  REIS(1, min_id, "first face id not 1");
  ref_geom->nface = max_id;
  RSS(ref_cell_id_range(ref_grid_edg(ref_grid), ref_grid_mpi(ref_grid), &min_id,
                        &max_id),
      "edge range");
  REIS(1, min_id, "first edge id not 1");
  ref_geom->nedge = max_id;
  return REF_SUCCESS;
}